

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_neg16_x86_64(void *d,void *a,uint32_t desc)

{
  intptr_t oprsz_00;
  undefined8 local_30;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (local_30 = 0; local_30 < oprsz_00; local_30 = local_30 + 2) {
    *(short *)((long)d + local_30) = -*(short *)((long)a + local_30);
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_neg16)(void *d, void *a, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint16_t)) {
        *(uint16_t *)((char *)d + i) = -*(uint16_t *)((char *)a + i);
    }
    clear_high(d, oprsz, desc);
}